

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

size_t __thiscall
QPDF::recoverStreamLength
          (QPDF *this,shared_ptr<InputSource> *input,QPDFObjGen og,qpdf_offset_t stream_offset)

{
  InputSource *pIVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  qpdf_offset_t qVar7;
  _Rb_tree_node_base *p_Var8;
  long *plVar9;
  size_type *psVar10;
  _Rb_tree_node_base *p_Var11;
  char cVar12;
  unsigned_long i;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  PatternFinder ef;
  Token t;
  string local_148;
  unsigned_long local_128;
  QPDFObjGen local_120;
  long *local_118;
  uint local_110;
  long local_108 [2];
  qpdf_offset_t local_f8;
  ulong local_f0;
  QPDF *local_e8;
  shared_ptr<InputSource> *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  
  pIVar1 = (input->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_120 = og;
  local_d0._0_8_ = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"attempting to recover stream length","");
  damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,(string *)local_d0);
  warn(this,(QPDFExc *)local_b0);
  QPDFExc::~QPDFExc((QPDFExc *)local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._0_8_ != &local_c0) {
    operator_delete((void *)local_d0._0_8_,local_c0._M_allocated_capacity + 1);
  }
  local_d0._0_8_ = &PTR__Finder_002f6b38;
  local_c0._M_allocated_capacity = (size_type)findEndstream;
  local_c0._8_8_ = 0;
  local_d0._8_8_ = this;
  bVar4 = InputSource::findFirst
                    ((((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"end",
                     stream_offset,0,(Finder *)local_d0);
  if (bVar4) {
    lVar6 = (**(code **)(**(long **)&(((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                     ->file).
                                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                        0x20))();
    i = lVar6 - stream_offset;
    if ((long)i < 0) {
      QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::error(i);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    ::qpdf::Tokenizer::readToken
              ((Token *)local_b0,&(_Var2._M_head_impl)->tokenizer,
               ((_Var2._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &(_Var2._M_head_impl)->last_object_description,true,0);
    iVar5 = std::__cxx11::string::compare(local_b0 + 8);
    if (iVar5 == 0) {
      pIVar1 = (((this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
               super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      qVar7 = InputSource::getLastOffset(pIVar1);
      (*pIVar1->_vptr_InputSource[5])(pIVar1,qVar7,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_allocated_capacity != local_58) {
      operator_delete((void *)local_68._M_allocated_capacity,local_58[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_allocated_capacity != &local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,
                      (ulong)(local_78._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._8_8_ != &local_98) {
      operator_delete((void *)local_b0._8_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
  }
  else {
    i = 0;
  }
  uVar15 = (ulong)local_120 >> 0x20;
  if (i != 0) {
    local_e0 = input;
    if ((long)i < 0) {
      QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(i);
    }
    _Var2._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    p_Var8 = ((_Var2._M_head_impl)->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
    ;
    p_Var11 = &((_Var2._M_head_impl)->xref_table)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_128 = i;
    local_f0 = uVar15;
    local_e8 = this;
    if (p_Var8 == p_Var11) {
      bVar4 = true;
      iVar14 = 0;
      iVar5 = 0;
    }
    else {
      local_d8 = i + stream_offset;
      lVar6 = 0;
      uVar13 = 0;
      uVar15 = 0;
      local_f8 = stream_offset;
      do {
        iVar5 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var8[1]._M_parent);
        if (((iVar5 == 1) &&
            (qVar7 = QPDFXRefEntry::getOffset((QPDFXRefEntry *)&p_Var8[1]._M_parent), lVar6 < qVar7)
            ) && (qVar7 < local_d8)) {
          uVar15 = *(ulong *)(p_Var8 + 1);
          uVar13 = uVar15 >> 0x20;
          lVar6 = qVar7;
        }
        iVar5 = (int)uVar13;
        iVar14 = (int)uVar15;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != p_Var11);
      bVar4 = lVar6 == 0;
      stream_offset = local_f8;
    }
    this = local_e8;
    input = local_e0;
    i = local_128;
    if (!bVar4) {
      if (iVar5 != (int)local_f0 || iVar14 != local_120.obj) {
        i = 0;
      }
    }
  }
  if (i == 0) {
    pIVar1 = (input->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"unable to recover stream data; treating stream as empty","");
    damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,&local_148);
    warn(this,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    cVar12 = '\x01';
    if (9 < i) {
      uVar15 = i;
      cVar3 = '\x04';
      do {
        cVar12 = cVar3;
        if (uVar15 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_002327be;
        }
        if (uVar15 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_002327be;
        }
        if (uVar15 < 10000) goto LAB_002327be;
        bVar4 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar3 = cVar12 + '\x04';
      } while (bVar4);
      cVar12 = cVar12 + '\x01';
    }
LAB_002327be:
    pIVar1 = (input->super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_118 = local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_118,local_110,i);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x285c57);
    psVar10 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_148.field_2._M_allocated_capacity = *psVar10;
      local_148.field_2._8_8_ = plVar9[3];
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar10;
      local_148._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_148._M_string_length = plVar9[1];
    *plVar9 = (long)psVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    damagedPDF((QPDFExc *)local_b0,this,pIVar1,stream_offset,&local_148);
    warn(this,(QPDFExc *)local_b0);
    QPDFExc::~QPDFExc((QPDFExc *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_118 != local_108) {
      operator_delete(local_118,local_108[0] + 1);
    }
  }
  return i;
}

Assistant:

size_t
QPDF::recoverStreamLength(
    std::shared_ptr<InputSource> input, QPDFObjGen og, qpdf_offset_t stream_offset)
{
    // Try to reconstruct stream length by looking for endstream or endobj
    warn(damagedPDF(*input, stream_offset, "attempting to recover stream length"));

    PatternFinder ef(*this, &QPDF::findEndstream);
    size_t length = 0;
    if (m->file->findFirst("end", stream_offset, 0, ef)) {
        length = toS(m->file->tell() - stream_offset);
        // Reread endstream but, if it was endobj, don't skip that.
        QPDFTokenizer::Token t = readToken(*m->file);
        if (t.getValue() == "endobj") {
            m->file->seek(m->file->getLastOffset(), SEEK_SET);
        }
    }

    if (length) {
        auto end = stream_offset + toO(length);
        qpdf_offset_t found_offset = 0;
        QPDFObjGen found_og;

        // Make sure this is inside this object
        for (auto const& [current_og, entry]: m->xref_table) {
            if (entry.getType() == 1) {
                qpdf_offset_t obj_offset = entry.getOffset();
                if (found_offset < obj_offset && obj_offset < end) {
                    found_offset = obj_offset;
                    found_og = current_og;
                }
            }
        }
        if (!found_offset || found_og == og) {
            // If we are trying to recover an XRef stream the xref table will not contain and
            // won't contain any entries, therefore we cannot check the found length. Otherwise we
            // found endstream\nendobj within the space allowed for this object, so we're probably
            // in good shape.
        } else {
            QTC::TC("qpdf", "QPDF found wrong endstream in recovery");
            length = 0;
        }
    }

    if (length == 0) {
        warn(damagedPDF(
            *input, stream_offset, "unable to recover stream data; treating stream as empty"));
    } else {
        warn(damagedPDF(
            *input, stream_offset, "recovered stream length: " + std::to_string(length)));
    }

    QTC::TC("qpdf", "QPDF recovered stream length");
    return length;
}